

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MAWInteractionType.hpp
# Opt level: O0

void __thiscall OpenMD::MAWInteractionType::~MAWInteractionType(MAWInteractionType *this)

{
  void *in_RDI;
  
  ~MAWInteractionType((MAWInteractionType *)0x2dddd8);
  operator_delete(in_RDI,0x88);
  return;
}

Assistant:

MAWInteractionType(RealType myD0, RealType myBeta0, RealType myR0,
                       RealType myCa1, RealType myCb1) {
      D_e  = myD0;
      beta = myBeta0;
      r_e  = myR0;
      ca1  = myCa1;
      cb1  = myCb1;
      setMAW();
    }